

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftUp(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  Node *pNVar1;
  Node *pNVar2;
  pointer pcVar3;
  Node *pNVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  Type TVar7;
  Type TVar8;
  uint8_t *puVar9;
  InfoType IVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  long lVar14;
  
  pNVar2 = this->mKeyVals;
  pNVar4 = pNVar2 + startIdx;
  pNVar1 = pNVar2 + startIdx;
  paVar12 = &(pNVar1->mData).first.field_2;
  (pNVar1->mData).first._M_dataplus._M_p = (pointer)paVar12;
  pcVar3 = pNVar1[-1].mData.first._M_dataplus._M_p;
  paVar11 = &pNVar2[startIdx - 1].mData.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar11) {
    uVar5 = *(undefined8 *)((long)&pNVar2[startIdx - 1].mData.first.field_2 + 8);
    paVar12->_M_allocated_capacity = paVar11->_M_allocated_capacity;
    *(undefined8 *)((long)&(pNVar1->mData).first.field_2 + 8) = uVar5;
  }
  else {
    (pNVar4->mData).first._M_dataplus._M_p = pcVar3;
    (pNVar4->mData).first.field_2._M_allocated_capacity =
         pNVar4[-1].mData.first.field_2._M_allocated_capacity;
  }
  (pNVar4->mData).first._M_string_length = pNVar4[-1].mData.first._M_string_length;
  pNVar4[-1].mData.first._M_dataplus._M_p = (pointer)paVar11;
  pNVar4[-1].mData.first._M_string_length = 0;
  pNVar4[-1].mData.first.field_2._M_local_buf[0] = '\0';
  uVar6 = *(undefined4 *)&pNVar4[-1].mData.second.field_0x4;
  TVar7 = pNVar4[-1].mData.second.tween.type_in;
  TVar8 = pNVar4[-1].mData.second.tween.type_out;
  (pNVar4->mData).second.type = pNVar4[-1].mData.second.type;
  *(undefined4 *)&(pNVar4->mData).second.field_0x4 = uVar6;
  (pNVar4->mData).second.tween.type_in = TVar7;
  (pNVar4->mData).second.tween.type_out = TVar8;
  (pNVar4->mData).second.tween.callback = pNVar4[-1].mData.second.tween.callback;
  if (startIdx - 1 != insertion_idx) {
    lVar13 = (insertion_idx - startIdx) + 1;
    lVar14 = startIdx * 0x38;
    do {
      pNVar4 = this->mKeyVals;
      std::__cxx11::string::operator=
                ((string *)((long)&pNVar4[-1].mData.first._M_dataplus._M_p + lVar14),
                 (string *)((long)&pNVar4[-2].mData.first._M_dataplus._M_p + lVar14));
      uVar5 = *(undefined8 *)((long)&pNVar4[-2].mData.second.tween.type_in + lVar14);
      *(undefined8 *)((long)&pNVar4[-1].mData.second.type + lVar14) =
           *(undefined8 *)((long)&pNVar4[-2].mData.second.type + lVar14);
      *(undefined8 *)((long)&pNVar4[-1].mData.second.tween.type_in + lVar14) = uVar5;
      *(undefined8 *)((long)&pNVar4[-1].mData.second.tween.callback + lVar14) =
           *(undefined8 *)((long)&pNVar4[-2].mData.second.tween.callback + lVar14);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + -0x38;
    } while (lVar13 != 0);
  }
  if (startIdx != insertion_idx) {
    puVar9 = this->mInfo;
    IVar10 = this->mInfoInc;
    do {
      puVar9[startIdx] = (char)IVar10 + puVar9[startIdx - 1];
      puVar9 = this->mInfo;
      IVar10 = this->mInfoInc;
      if (0xff < puVar9[startIdx] + IVar10) {
        this->mMaxNumElementsAllowed = 0;
      }
      startIdx = startIdx - 1;
    } while (insertion_idx != startIdx);
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }